

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Filter<double>::setTransferFunction(Filter<double> *this,TransferFunction<double> *tf)

{
  size_t sVar1;
  TransferFunction<double> *tf_local;
  Filter<double> *this_local;
  
  TransferFunction<double>::operator=(&this->tf_,tf);
  sVar1 = TransferFunction<double>::getDenominatorSize(&this->tf_);
  this->n_ = sVar1;
  sVar1 = TransferFunction<double>::getNumeratorSize(&this->tf_);
  this->m_ = sVar1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->y_,this->n_);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
            (&this->x_,this->m_);
  resetState(this);
  return;
}

Assistant:

void Filter<T>::setTransferFunction(const TransferFunction<T>& tf) {
            tf_ = tf;
            n_ = tf_.getDenominatorSize();
            m_ = tf_.getNumeratorSize();
            y_.resize(n_);
            x_.resize(m_);
            resetState();
        }